

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_lib_module.cc
# Opt level: O0

void __thiscall
tvm::runtime::SystemLibModuleNode::RegisterSymbol(SystemLibModuleNode *this,string *name,void *ptr)

{
  void **ppvVar1;
  bool bVar2;
  bool bVar3;
  ostringstream *poVar4;
  ostream *poVar5;
  pointer ppVar6;
  mapped_type *ppvVar7;
  LogMessage local_1e8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_true>
  local_1d0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_true>
  local_1c8;
  iterator it;
  LogMessageFatal local_1b0;
  void **ctx_addr;
  void *ptr_local;
  string *name_local;
  SystemLibModuleNode *this_local;
  
  ctx_addr = (void **)ptr;
  ptr_local = name;
  name_local = (string *)this;
  bVar2 = std::operator==(name,"__tvm_module_ctx");
  if (bVar2) {
    *ctx_addr = this;
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ptr_local,"__tvm_dev_mblob");
    if (bVar2) {
      if (this->module_blob_ != (void *)0x0) {
        dmlc::LogMessageFatal::LogMessageFatal
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/system_lib_module.cc"
                   ,0x4c);
        poVar4 = dmlc::LogMessageFatal::stream_abi_cxx11_(&local_1b0);
        poVar5 = std::operator<<((ostream *)poVar4,"Check failed: module_blob_ == nullptr");
        poVar5 = std::operator<<(poVar5,": ");
        std::operator<<(poVar5,"Resetting mobule blob?");
        dmlc::LogMessageFatal::~LogMessageFatal(&local_1b0);
      }
      this->module_blob_ = ctx_addr;
    }
    else {
      local_1c8._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
           ::find(&this->tbl_,(key_type *)ptr_local);
      local_1d0._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
           ::end(&this->tbl_);
      bVar3 = std::__detail::operator!=(&local_1c8,&local_1d0);
      ppvVar1 = ctx_addr;
      bVar2 = false;
      if (bVar3) {
        ppVar6 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_false,_true>
                               *)&local_1c8);
        bVar2 = ppvVar1 != (void **)ppVar6->second;
      }
      if (bVar2) {
        dmlc::LogMessage::LogMessage
                  (&local_1e8,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/system_lib_module.cc"
                   ,0x51);
        poVar5 = dmlc::LogMessage::stream(&local_1e8);
        poVar5 = std::operator<<(poVar5,"SystemLib symbol ");
        poVar5 = std::operator<<(poVar5,(string *)ptr_local);
        poVar5 = std::operator<<(poVar5," get overriden to a different address ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,ctx_addr);
        poVar5 = std::operator<<(poVar5,"->");
        ppVar6 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_false,_true>
                               *)&local_1c8);
        std::ostream::operator<<(poVar5,ppVar6->second);
        dmlc::LogMessage::~LogMessage(&local_1e8);
      }
      ppvVar1 = ctx_addr;
      ppvVar7 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                ::operator[](&this->tbl_,(key_type *)ptr_local);
      *ppvVar7 = ppvVar1;
    }
  }
  return;
}

Assistant:

void RegisterSymbol(const std::string &name, void *ptr) {
    /* [RISCV-DLR] multi-threading is not supported, so lock is unnecessary */
    //std::lock_guard<std::mutex> lock(mutex_);
    if (name == symbol::tvm_module_ctx) {
      void **ctx_addr = reinterpret_cast<void **>(ptr);
      *ctx_addr = this;
    } else if (name == symbol::tvm_dev_mblob) {
      // Record pointer to content of submodules to be loaded.
      // We defer loading submodules to the first call to GetFunction().
      // The reason is that RegisterSymbol() gets called when initializing the
      // syslib (i.e. library loading time), and the registeries aren't ready
      // yet. Therefore, we might not have the functionality to load submodules
      // now.
      CHECK(module_blob_ == nullptr) << "Resetting mobule blob?";
      module_blob_ = ptr;
    } else {
      auto it = tbl_.find(name);
      if (it != tbl_.end() && ptr != it->second) {
        LOG(WARNING) << "SystemLib symbol " << name
                     << " get overriden to a different address "
                     << ptr << "->" << it->second;
      }
      tbl_[name] = ptr;
    }
  }